

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.cpp
# Opt level: O0

void __kmp_dispatch_dxo<unsigned_int>(int *gtid_ref,int *cid_ref,ident_t *loc_ref)

{
  kmp_info_t *pkVar1;
  dispatch_shared_info_t *pdVar2;
  int *in_RDI;
  dispatch_shared_info_template<unsigned_int> *sh;
  kmp_info_t *th;
  int gtid;
  dispatch_private_info_template<unsigned_int> *pr;
  undefined4 in_stack_ffffffffffffffd8;
  dispatch_private_info_t *in_stack_ffffffffffffffe0;
  
  pkVar1 = __kmp_threads[*in_RDI];
  if ((__kmp_env_consistency_check != 0) &&
     (in_stack_ffffffffffffffe0 = ((pkVar1->th).th_dispatch)->th_dispatch_pr_current,
     in_stack_ffffffffffffffe0->pushed_ws != ct_none)) {
    __kmp_pop_sync((int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                   (cons_type)in_stack_ffffffffffffffe0,
                   (ident_t *)CONCAT44(*in_RDI,in_stack_ffffffffffffffd8));
  }
  if ((((pkVar1->th).th_team)->t).t_serialized == 0) {
    pdVar2 = ((pkVar1->th).th_dispatch)->th_dispatch_sh_current;
    if (__kmp_env_consistency_check == 0) {
      in_stack_ffffffffffffffe0 = ((pkVar1->th).th_dispatch)->th_dispatch_pr_current;
    }
    if (__kmp_itt_fsync_releasing_ptr__3_0 != (undefined1 *)0x0) {
      (*(code *)__kmp_itt_fsync_releasing_ptr__3_0)((undefined1 *)((long)&pdVar2->u + 8));
    }
    in_stack_ffffffffffffffe0->ordered_bumped = in_stack_ffffffffffffffe0->ordered_bumped + 1;
    test_then_inc<int>((kmp_int32 *)&(pdVar2->u).s32.ordered_iteration);
  }
  return;
}

Assistant:

static void
__kmp_dispatch_dxo( int *gtid_ref, int *cid_ref, ident_t *loc_ref )
{
    typedef typename traits_t< UT >::signed_t    ST;
    dispatch_private_info_template< UT > * pr;

    int gtid = *gtid_ref;
//    int  cid = *cid_ref;
    kmp_info_t *th = __kmp_threads[ gtid ];
    KMP_DEBUG_ASSERT( th -> th.th_dispatch );

    KD_TRACE(100, ("__kmp_dispatch_dxo: T#%d called\n", gtid ) );
    if ( __kmp_env_consistency_check ) {
        pr = reinterpret_cast< dispatch_private_info_template< UT >* >
            ( th -> th.th_dispatch -> th_dispatch_pr_current );
        if ( pr -> pushed_ws != ct_none ) {
            __kmp_pop_sync( gtid, ct_ordered_in_pdo, loc_ref );
        }
    }

    if ( ! th -> th.th_team -> t.t_serialized ) {
        dispatch_shared_info_template< UT >  * sh = reinterpret_cast< dispatch_shared_info_template< UT >* >
            ( th -> th.th_dispatch -> th_dispatch_sh_current );

        if ( ! __kmp_env_consistency_check ) {
            pr = reinterpret_cast< dispatch_private_info_template< UT >* >
                ( th -> th.th_dispatch -> th_dispatch_pr_current );
        }

        KMP_FSYNC_RELEASING( & sh->u.s.ordered_iteration );
        #if ! defined( KMP_GOMP_COMPAT )
            if ( __kmp_env_consistency_check ) {
                if ( pr->ordered_bumped != 0 ) {
                    struct cons_header *p = __kmp_threads[ gtid ]->th.th_cons;
                    /* How to test it? - OM */
                    __kmp_error_construct2(
                        kmp_i18n_msg_CnsMultipleNesting,
                        ct_ordered_in_pdo, loc_ref,
                        & p->stack_data[ p->w_top ]
                    );
                }
            }
        #endif /* !defined(KMP_GOMP_COMPAT) */

        KMP_MB();       /* Flush all pending memory write invalidates.  */

        pr->ordered_bumped += 1;

        KD_TRACE(1000, ("__kmp_dispatch_dxo: T#%d bumping ordered ordered_bumped=%d\n",
                        gtid, pr->ordered_bumped ) );

        KMP_MB();       /* Flush all pending memory write invalidates.  */

        /* TODO use general release procedure? */
        test_then_inc< ST >( (volatile ST *) & sh->u.s.ordered_iteration );

        KMP_MB();       /* Flush all pending memory write invalidates.  */
    }
    KD_TRACE(100, ("__kmp_dispatch_dxo: T#%d returned\n", gtid ) );
}